

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O1

ArrayFeatureType_ShapeRange * __thiscall
CoreML::Specification::ArrayFeatureType::mutable_shaperange(ArrayFeatureType *this)

{
  ArrayFeatureType_ShapeRange *this_00;
  
  if (this->_oneof_case_[0] != 0x1f) {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    this_00 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(this_00);
    (this->ShapeFlexibility_).shaperange_ = this_00;
  }
  return (ArrayFeatureType_ShapeRange *)(this->ShapeFlexibility_).enumeratedshapes_;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_ShapeRange* ArrayFeatureType::mutable_shaperange() {
  if (!has_shaperange()) {
    clear_ShapeFlexibility();
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = new ::CoreML::Specification::ArrayFeatureType_ShapeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ArrayFeatureType.shapeRange)
  return ShapeFlexibility_.shaperange_;
}